

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *param_3,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *r,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             *cStatus,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *rStatus,bool isOptimal)

{
  char cVar1;
  int iVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  VarStatus *pVVar7;
  bool bVar8;
  int iVar9;
  cpp_dec_float<200U,_int,_void> *v;
  VarStatus VVar10;
  long lVar11;
  long lVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  undefined4 *puVar15;
  pointer pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  undefined4 *puVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  long lVar21;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aik;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  fpclass_type local_6b8;
  undefined1 local_6a8 [32];
  undefined1 local_688 [16];
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [13];
  undefined3 uStack_63b;
  int iStack_638;
  bool bStack_634;
  undefined8 local_630;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_628;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_620;
  cpp_dec_float<200U,_int,_void> local_618;
  undefined1 local_598 [32];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [13];
  undefined3 uStack_52b;
  int iStack_528;
  bool bStack_524;
  undefined8 local_520;
  cpp_dec_float<200U,_int,_void> local_518;
  cpp_dec_float<200U,_int,_void> local_498;
  cpp_dec_float<200U,_int,_void> local_418;
  uint local_398 [28];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [13];
  undefined3 uStack_2bb;
  undefined5 uStack_2b8;
  undefined8 local_2b0;
  undefined4 local_2a0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar22 = 0;
  VVar10 = cStatus->data[this->m_k];
  if (VVar10 == ON_UPPER) {
    cVar1 = this->m_strictUp;
joined_r0x0057c34e:
    if (cVar1 == '\0') {
      return;
    }
  }
  else {
    if (VVar10 != FIXED) {
      if (VVar10 != ON_LOWER) {
        return;
      }
      cVar1 = this->m_strictLo;
      goto joined_r0x0057c34e;
    }
    if (this->m_maxSense == true) {
      iVar9 = this->m_j;
      pnVar4 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar4[iVar9].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0057c23a:
        iVar9 = this->m_j;
        pnVar4 = (r->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pnVar4[iVar9].m_backend.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_6a8,0,(type *)0x0);
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar4[iVar9].m_backend,(cpp_dec_float<200U,_int,_void> *)local_6a8);
          if ((iVar9 < 0) && (this->m_strictLo != false)) goto LAB_0057c354;
        }
        goto LAB_0057c28e;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<200U,_int,_void> *)local_6a8,0,(type *)0x0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&pnVar4[iVar9].m_backend,(cpp_dec_float<200U,_int,_void> *)local_6a8);
      if ((iVar9 < 1) || (this->m_strictUp == false)) goto LAB_0057c23a;
    }
    else {
LAB_0057c28e:
      if (this->m_maxSense != false) {
        return;
      }
      iVar9 = this->m_j;
      pnVar4 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar4[iVar9].m_backend.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_6a8,0,(type *)0x0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&pnVar4[iVar9].m_backend,(cpp_dec_float<200U,_int,_void> *)local_6a8);
        if ((0 < iVar9) && (this->m_strictLo != false)) goto LAB_0057c354;
      }
      iVar9 = this->m_j;
      pnVar4 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar4[iVar9].m_backend.fpclass == cpp_dec_float_NaN) {
        return;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<200U,_int,_void> *)local_6a8,0,(type *)0x0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&pnVar4[iVar9].m_backend,(cpp_dec_float<200U,_int,_void> *)local_6a8);
      if (-1 < iVar9) {
        return;
      }
      if (this->m_strictUp != true) {
        return;
      }
    }
  }
LAB_0057c354:
  pnVar17 = &this->m_kObj;
  pcVar13 = &local_618;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar13->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + (ulong)bVar22 * -8 + 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_618.exp = (this->m_kObj).m_backend.exp;
  local_618.neg = (this->m_kObj).m_backend.neg;
  local_618.fpclass = (this->m_kObj).m_backend.fpclass;
  local_618.prec_elem = (this->m_kObj).m_backend.prec_elem;
  local_628 = x;
  local_620 = cStatus;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_418,
               &(this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_i);
  iVar9 = (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (0 < iVar9) {
    lVar21 = 0;
    lVar11 = 0;
    do {
      pNVar3 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar2 = *(int *)((long)(&pNVar3->val + 1) + lVar21);
      if (iVar2 != this->m_i) {
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(pNVar3->val).m_backend.data._M_elems + lVar21);
        pcVar18 = &(y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
        local_630._0_4_ = cpp_dec_float_finite;
        local_630._4_4_ = 0x1c;
        local_6a8._0_16_ = (undefined1  [16])0x0;
        local_6a8._16_16_ = (undefined1  [16])0x0;
        local_688 = (undefined1  [16])0x0;
        local_678 = (undefined1  [16])0x0;
        local_668 = (undefined1  [16])0x0;
        local_658 = (undefined1  [16])0x0;
        local_648 = SUB1613((undefined1  [16])0x0,0);
        uStack_63b = 0;
        iStack_638 = 0;
        bStack_634 = false;
        v = pcVar13;
        if (((cpp_dec_float<200U,_int,_void> *)local_6a8 != pcVar18) &&
           (v = pcVar18, pcVar13 != (cpp_dec_float<200U,_int,_void> *)local_6a8)) {
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_6a8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar22 * -8 + 4);
          }
          iStack_638 = *(int *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar21);
          bStack_634 = *(bool *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar21 + 4);
          local_630 = *(undefined8 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar21 + 8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_6a8,v);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_618,(cpp_dec_float<200U,_int,_void> *)local_6a8);
        iVar9 = (this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
      }
      lVar11 = lVar11 + 1;
      lVar21 = lVar21 + 0x84;
    } while (lVar11 < iVar9);
  }
  local_630._0_4_ = cpp_dec_float_finite;
  local_630._4_4_ = 0x1c;
  local_6a8._0_16_ = (undefined1  [16])0x0;
  local_6a8._16_16_ = (undefined1  [16])0x0;
  local_688 = (undefined1  [16])0x0;
  local_678 = (undefined1  [16])0x0;
  local_668 = (undefined1  [16])0x0;
  local_658 = (undefined1  [16])0x0;
  local_648 = SUB1613((undefined1  [16])0x0,0);
  uStack_63b = 0;
  iStack_638 = 0;
  bStack_634 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_6a8,&local_618,&local_418);
  iVar9 = this->m_i;
  pnVar4 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_6a8;
  pnVar16 = pnVar4 + iVar9;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
    pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  pnVar4[iVar9].m_backend.exp = iStack_638;
  pnVar4[iVar9].m_backend.neg = bStack_634;
  pnVar4[iVar9].m_backend.fpclass = (fpclass_type)local_630;
  pnVar4[iVar9].m_backend.prec_elem = local_630._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k),0.0);
  local_520._0_4_ = cpp_dec_float_finite;
  local_520._4_4_ = 0x1c;
  local_598._0_16_ = (undefined1  [16])0x0;
  local_598._16_16_ = (undefined1  [16])0x0;
  local_578 = (undefined1  [16])0x0;
  local_568 = (undefined1  [16])0x0;
  local_558 = (undefined1  [16])0x0;
  local_548 = (undefined1  [16])0x0;
  local_538 = SUB1613((undefined1  [16])0x0,0);
  uStack_52b = 0;
  iStack_528 = 0;
  bStack_524 = false;
  pcVar13 = &local_618;
  if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)local_598 != &this->m_aij) {
    pcVar13 = &local_618;
    puVar14 = (uint *)local_598;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar14 = (pcVar13->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar22 * -2 + 1) * 4);
      puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
    }
    iStack_528 = local_618.exp;
    bStack_524 = local_618.neg;
    local_520._0_4_ = local_618.fpclass;
    local_520._4_4_ = local_618.prec_elem;
    pcVar13 = &(this->m_aij).m_backend;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_598,pcVar13);
  local_2b0._0_4_ = cpp_dec_float_finite;
  local_2b0._4_4_ = 0x1c;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2bb = 0;
  uStack_2b8._0_4_ = 0;
  uStack_2b8._4_1_ = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_328,(cpp_dec_float<200U,_int,_void> *)local_598
             ,&local_418);
  local_630._0_4_ = cpp_dec_float_finite;
  local_630._4_4_ = 0x1c;
  local_6a8._0_16_ = (undefined1  [16])0x0;
  local_6a8._16_16_ = (undefined1  [16])0x0;
  local_688 = (undefined1  [16])0x0;
  local_678 = (undefined1  [16])0x0;
  local_668 = (undefined1  [16])0x0;
  local_658 = (undefined1  [16])0x0;
  local_648 = SUB1613((undefined1  [16])0x0,0);
  uStack_63b = 0;
  iStack_638 = 0;
  bStack_634 = false;
  if ((cpp_dec_float<200U,_int,_void> *)local_6a8 != &(this->m_jObj).m_backend) {
    pnVar17 = &this->m_jObj;
    puVar14 = (uint *)local_6a8;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar14 = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + (ulong)bVar22 * -8 + 4);
      puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
    }
    iStack_638 = (this->m_jObj).m_backend.exp;
    bStack_634 = (this->m_jObj).m_backend.neg;
    local_630._0_4_ = (this->m_jObj).m_backend.fpclass;
    local_630._4_4_ = (this->m_jObj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            ((cpp_dec_float<200U,_int,_void> *)local_6a8,(cpp_dec_float<200U,_int,_void> *)local_328
            );
  iVar9 = this->m_j;
  pnVar4 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_6a8;
  pnVar16 = pnVar4 + iVar9;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
    pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  pnVar4[iVar9].m_backend.exp = iStack_638;
  pnVar4[iVar9].m_backend.neg = bStack_634;
  pnVar4[iVar9].m_backend.fpclass = (fpclass_type)local_630;
  pnVar4[iVar9].m_backend.prec_elem = local_630._4_4_;
  VVar10 = FIXED;
  if (this->m_jFixed == false) {
    iVar9 = this->m_j;
    pnVar4 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = pnVar4 + iVar9;
    puVar14 = local_398;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar14 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
    }
    iVar2 = pnVar4[iVar9].m_backend.exp;
    bVar8 = pnVar4[iVar9].m_backend.neg;
    uVar5._0_4_ = pnVar4[iVar9].m_backend.fpclass;
    uVar5._4_4_ = pnVar4[iVar9].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_b0,0,(type *)0x0);
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_498,this);
    puVar14 = local_398;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_6a8;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pcVar13->data)._M_elems[0] = *puVar14;
      puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
    }
    iStack_638 = iVar2;
    bStack_634 = bVar8;
    local_630 = uVar5;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)local_6a8,&local_b0);
    if (((fpclass_type)local_630 != cpp_dec_float_NaN) && (local_498.fpclass != cpp_dec_float_NaN))
    {
      iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        ((cpp_dec_float<200U,_int,_void> *)local_6a8,&local_498);
      VVar10 = ON_LOWER;
      if (0 < iVar9) goto LAB_0057c92e;
    }
    iVar9 = this->m_j;
    pnVar4 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = pnVar4 + iVar9;
    puVar15 = local_2a0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    }
    iVar2 = pnVar4[iVar9].m_backend.exp;
    bVar8 = pnVar4[iVar9].m_backend.neg;
    uVar6._0_4_ = pnVar4[iVar9].m_backend.fpclass;
    uVar6._4_4_ = pnVar4[iVar9].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_518,this);
    puVar15 = local_2a0;
    puVar19 = (undefined4 *)local_6a8;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar19 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
    }
    bStack_634 = bVar8;
    if ((bVar8 == true) && (local_6a8._0_4_ != 0 || (fpclass_type)uVar6 != cpp_dec_float_finite)) {
      bStack_634 = false;
    }
    if ((((fpclass_type)uVar6 != cpp_dec_float_NaN) && (local_518.fpclass != cpp_dec_float_NaN)) &&
       (iStack_638 = iVar2, local_630 = uVar6,
       iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_6a8,&local_518), iVar9 < 1)) {
      iVar9 = this->m_j;
      pnVar4 = (local_628->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar16 = pnVar4 + iVar9;
      pnVar17 = &local_130;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = pnVar4[iVar9].m_backend.exp;
      local_130.m_backend.neg = pnVar4[iVar9].m_backend.neg;
      local_130.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
      local_130.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
      pnVar17 = &this->m_Lo_j;
      pnVar20 = &local_1b0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + (ulong)bVar22 * -8 + 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (this->m_Lo_j).m_backend.exp;
      local_1b0.m_backend.neg = (this->m_Lo_j).m_backend.neg;
      local_1b0.m_backend.fpclass = (this->m_Lo_j).m_backend.fpclass;
      local_1b0.m_backend.prec_elem = (this->m_Lo_j).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_230,this);
      bVar8 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_130,&local_1b0,&local_230);
      VVar10 = ON_LOWER;
      if (bVar8) goto LAB_0057c92e;
    }
    VVar10 = ON_UPPER;
  }
LAB_0057c92e:
  pVVar7 = local_620->data;
  pVVar7[this->m_j] = VVar10;
  pVVar7[this->m_k] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}